

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> __thiscall
llvm::WritableMemoryBuffer::getNewMemBuffer
          (WritableMemoryBuffer *this,size_t Size,Twine *BufferName)

{
  bool bVar1;
  pointer this_00;
  char *__s;
  unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> SB;
  Twine *BufferName_local;
  size_t Size_local;
  
  SB._M_t.
  super___uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
  ._M_t.
  super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
  .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl =
       (__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
        )(__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
          )BufferName;
  getNewUninitMemBuffer((WritableMemoryBuffer *)&stack0xffffffffffffffd8,Size,BufferName);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffd8);
  if (bVar1) {
    this_00 = std::
              unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
              ::operator->((unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
                            *)&stack0xffffffffffffffd8);
    __s = getBufferStart(this_00);
    memset(__s,0,Size);
    std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>::
    unique_ptr((unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
                *)this,(unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
                        *)&stack0xffffffffffffffd8);
  }
  else {
    std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>::
    unique_ptr<std::default_delete<llvm::WritableMemoryBuffer>,void>
              ((unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>
                *)this,(nullptr_t)0x0);
  }
  std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>::
  ~unique_ptr((unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
               *)&stack0xffffffffffffffd8);
  return (__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
          )(__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<WritableMemoryBuffer>
WritableMemoryBuffer::getNewMemBuffer(size_t Size, const Twine &BufferName) {
  auto SB = WritableMemoryBuffer::getNewUninitMemBuffer(Size, BufferName);
  if (!SB)
    return nullptr;
  memset(SB->getBufferStart(), 0, Size);
  return SB;
}